

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool cppnet::CheckConnect(uint64_t sock)

{
  int iVar1;
  socklen_t local_20;
  int local_1c;
  socklen_t len;
  int32_t ret;
  uint64_t sock_local;
  
  local_1c = 0;
  local_20 = 4;
  _len = sock;
  iVar1 = getsockopt((int)sock,1,4,&local_1c,&local_20);
  if (iVar1 == -1) {
    sock_local._7_1_ = false;
  }
  else if (local_1c == 0) {
    sock_local._7_1_ = true;
  }
  else {
    sock_local._7_1_ = false;
  }
  return sock_local._7_1_;
}

Assistant:

bool CheckConnect(const uint64_t sock) {
    /*struct pollfd fd;
    int32_t ret = 0;
    socklen_t len = 0;
    fd.fd = sock;
    fd.events = POLLOUT;
    if (poll(&fd, 1, 20000) == -1) {
        if(errno != EINTR){
            return false;
        }
    }*/
    int32_t ret = 0;
    socklen_t len = sizeof(ret);
    if (getsockopt(sock, SOL_SOCKET, SO_ERROR, &ret, &len) == -1) {
        return false;
    }
    if(ret != 0) {
        return false;
    }
    return true;
}